

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

bool __thiscall cppforth::Forth::refillNextLine(Forth *this)

{
  Cell CVar1;
  pointer pbVar2;
  bool bVar3;
  Cell CVar4;
  ulong uVar5;
  
  requireDStackAvailable(this,1,"REFILLNEXTLINE");
  CVar1 = this->sourceid;
  CVar4 = dataSpaceAtCell(this,this->VarOffsetBlkAddress);
  if (((-1 < (int)CVar1) && (CVar4 == 0)) &&
     (pbVar2 = (this->inputBufferStrings).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
     uVar5 = this->inputBufferStringsCurrent + 1, this->inputBufferStringsCurrent = uVar5,
     uVar5 < (ulong)((long)pbVar2 -
                     (long)(this->inputBufferStrings).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5))) {
    bVar3 = setSourceBuffer(this);
    return bVar3;
  }
  return false;
}

Assistant:

bool refillNextLine() {
			REQUIRE_DSTACK_AVAILABLE(1, "REFILLNEXTLINE");
			auto sourceid_ = getSourceId();
			auto blk = getDataCell(VarOffsetBlkAddress);
			if (sourceid_ >= 0 and blk==0) { // if input from file or from input buffer
				inputBufferStringsCurrent++;
				if (inputBufferStringsCurrent < inputBufferStrings.size()) {
					if (setSourceBuffer()) {
						//std::cerr << inputBufferStrings[inputBufferStringsCurrent];
							
						return true;
					}
					else {
						return false;
					}
				}
				else {
					return false;
				}
			}
			else {
				return false; // input from EVALUATE and LOAD
			}
			
		}